

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate.cpp
# Opt level: O0

void __thiscall CaDiCaL::Internal::build_chain_for_empty(Internal *this)

{
  Clause *this_00;
  bool bVar1;
  literal_iterator piVar2;
  uint64_t *puVar3;
  Internal *in_RDI;
  uint64_t id;
  uint uidx;
  int *lit;
  literal_iterator __end1;
  literal_iterator __begin1;
  Clause *__range1;
  int in_stack_ffffffffffffffbc;
  value_type_conflict5 *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  literal_iterator local_18;
  
  if (((in_RDI->lrat & 1U) != 0) &&
     (bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)), bVar1)) {
    this_00 = in_RDI->conflict;
    local_18 = Clause::begin(this_00);
    piVar2 = Clause::end(this_00);
    for (; local_18 != piVar2; local_18 = local_18 + 1) {
      in_stack_ffffffffffffffd4 = vlit(in_RDI,in_stack_ffffffffffffffbc);
      puVar3 = unit_clauses(in_RDI,in_stack_ffffffffffffffbc);
      in_stack_ffffffffffffffc8 = (value_type_conflict5 *)*puVar3;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void Internal::build_chain_for_empty () {
  if (!lrat || !lrat_chain.empty ())
    return;
  assert (!level);
  assert (lrat_chain.empty ());
  assert (conflict);
  LOG (conflict, "lrat for global empty clause with conflict");
  for (auto &lit : *conflict) {
    assert (val (lit) < 0);
    const unsigned uidx = vlit (-lit);
    uint64_t id = unit_clauses (uidx);
    lrat_chain.push_back (id);
  }
  lrat_chain.push_back (conflict->id);
}